

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  int iVar1;
  int iVar2;
  Type TVar3;
  Message *pMVar4;
  TestPartResult *val;
  AssertionResult *pAVar5;
  char *__needle;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  char *pcVar6;
  undefined4 in_register_00000084;
  AssertionResult AVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  String *in_stack_fffffffffffffe80;
  char (*in_stack_fffffffffffffe88) [2];
  Message *in_stack_fffffffffffffe90;
  AssertionResult local_a8;
  AssertionResult local_98;
  TestPartResult *local_88;
  TestPartResult *r;
  AssertionResult local_78;
  int local_64;
  int local_60;
  int i;
  Message local_50;
  Message msg;
  String expected;
  Type type_local;
  TestPartResultArray *results_local;
  char *param_2_local;
  char *param_1_local;
  char *param_0_local;
  
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar6 = "1 non-fatal failure";
  if ((Type)substr == kFatalFailure) {
    pcVar6 = "1 fatal failure";
  }
  String::String((String *)&msg,pcVar6);
  Message::Message(in_stack_fffffffffffffe90);
  iVar1 = TestPartResultArray::size(this);
  if (iVar1 == 1) {
    local_88 = TestPartResultArray::GetTestPartResult(this,0);
    TVar3 = TestPartResult::type(local_88);
    if (TVar3 == (Type)substr) {
      pcVar6 = TestPartResult::message(local_88);
      __needle = (char *)std::__cxx11::string::c_str();
      pcVar6 = strstr(pcVar6,__needle);
      if (pcVar6 == (char *)0x0) {
        AssertionFailure();
        pAVar5 = AssertionResult::operator<<(&local_a8,(char (*) [11])0x178018);
        pAVar5 = AssertionResult::operator<<(pAVar5,(String *)&msg);
        pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [14])" containing \"");
        pAVar5 = AssertionResult::operator<<(pAVar5,in_stack_00000008);
        pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [3])0x178874);
        in_stack_fffffffffffffe80 =
             (String *)AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
        pAVar5 = AssertionResult::operator<<((AssertionResult *)in_stack_fffffffffffffe80,local_88);
        AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar5);
        AssertionResult::~AssertionResult((AssertionResult *)0x148589);
      }
      else {
        AssertionSuccess();
      }
    }
    else {
      AssertionFailure();
      pAVar5 = AssertionResult::operator<<(&local_98,(char (*) [11])0x178018);
      pAVar5 = AssertionResult::operator<<(pAVar5,(String *)&msg);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [2])0x1787a0);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [11])"  Actual:\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,local_88);
      AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar5);
      AssertionResult::~AssertionResult((AssertionResult *)0x148442);
    }
  }
  else {
    pMVar4 = Message::operator<<(&local_50,(char (*) [11])0x178018);
    Message::operator<<(pMVar4,(String *)&msg);
    pMVar4 = Message::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    pMVar4 = Message::operator<<(pMVar4,(char (*) [11])0x17800c);
    local_60 = TestPartResultArray::size(this);
    pMVar4 = Message::operator<<(pMVar4,&local_60);
    Message::operator<<(pMVar4,(char (*) [10])" failures");
    local_64 = 0;
    while( true ) {
      iVar1 = local_64;
      iVar2 = TestPartResultArray::size(this);
      if (iVar2 <= iVar1) break;
      pMVar4 = Message::operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      val = TestPartResultArray::GetTestPartResult(this,local_64);
      Message::operator<<(pMVar4,val);
      local_64 = local_64 + 1;
    }
    AssertionFailure();
    pAVar5 = AssertionResult::operator<<(&local_78,&local_50);
    AssertionResult::AssertionResult((AssertionResult *)param_1,pAVar5);
    AssertionResult::~AssertionResult((AssertionResult *)0x148328);
  }
  r._4_4_ = 1;
  Message::~Message((Message *)0x1485ca);
  String::~String(in_stack_fffffffffffffe80);
  AVar7.message_.ptr_ = extraout_RDX.ptr_;
  AVar7._0_8_ = param_1;
  return AVar7;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}